

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFImporter.cpp
# Opt level: O0

void SetMaterialColorProperty
               (vector<int,_std::allocator<int>_> *embeddedTexIdxs,Asset *param_2,TexProperty prop,
               aiMaterial *mat,aiTextureType texType,char *pKey,uint type,uint idx)

{
  bool bVar1;
  uint uVar2;
  Texture *pTVar3;
  Image *pIVar4;
  float *pfVar5;
  undefined1 local_44c [8];
  aiColor4D col;
  int texIdx;
  aiString uri;
  uint type_local;
  char *pKey_local;
  aiTextureType texType_local;
  aiMaterial *mat_local;
  Asset *param_1_local;
  vector<int,_std::allocator<int>_> *embeddedTexIdxs_local;
  
  uri.data._1016_4_ = type;
  unique0x100001af = pKey;
  bVar1 = glTF::Ref::operator_cast_to_bool((Ref *)&prop);
  if (bVar1) {
    pTVar3 = glTF::Ref<glTF::Texture>::operator->(&prop.texture);
    bVar1 = glTF::Ref::operator_cast_to_bool((Ref *)&pTVar3->source);
    if (bVar1) {
      pTVar3 = glTF::Ref<glTF::Texture>::operator->(&prop.texture);
      pIVar4 = glTF::Ref<glTF::Image>::operator->(&pTVar3->source);
      aiString::aiString((aiString *)&col.a,&pIVar4->uri);
      pTVar3 = glTF::Ref<glTF::Texture>::operator->(&prop.texture);
      uVar2 = glTF::Ref<glTF::Image>::GetIndex(&pTVar3->source);
      pfVar5 = (float *)std::vector<int,_std::allocator<int>_>::operator[]
                                  (embeddedTexIdxs,(ulong)uVar2);
      col.b = *pfVar5;
      if (col.b != -NAN) {
        texIdx._0_1_ = 0x2a;
        uVar2 = Assimp::ASSIMP_itoa10((char *)((long)&texIdx + 1),0x3ff,(int32_t)col.b);
        col.a = (float)(uVar2 + 1);
      }
      aiMaterial::AddProperty(mat,(aiString *)&col.a,"$tex.file",texType,0);
    }
  }
  else {
    aiColor4t<float>::aiColor4t((aiColor4t<float> *)local_44c);
    glTFCommon::CopyValue(&prop.color,(aiColor4D *)local_44c);
    aiMaterial::AddProperty
              (mat,(aiColor4D *)local_44c,1,stack0xffffffffffffffd0,uri.data._1016_4_,idx);
  }
  return;
}

Assistant:

inline
void SetMaterialColorProperty(std::vector<int>& embeddedTexIdxs, Asset& /*r*/, glTF::TexProperty prop, aiMaterial* mat,
        aiTextureType texType, const char* pKey, unsigned int type, unsigned int idx) {
    if (prop.texture) {
        if (prop.texture->source) {
            aiString uri(prop.texture->source->uri);

            int texIdx = embeddedTexIdxs[prop.texture->source.GetIndex()];
            if (texIdx != -1) { // embedded
                // setup texture reference string (copied from ColladaLoader::FindFilenameForEffectTexture)
                uri.data[0] = '*';
                uri.length = 1 + ASSIMP_itoa10(uri.data + 1, MAXLEN - 1, texIdx);
            }

            mat->AddProperty(&uri, _AI_MATKEY_TEXTURE_BASE, texType, 0);
        }
    } else {
        aiColor4D col;
        CopyValue(prop.color, col);
        mat->AddProperty(&col, 1, pKey, type, idx);
    }
}